

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.h
# Opt level: O2

void __thiscall Jinx::Impl::FunctionSignature::FunctionSignature(FunctionSignature *this)

{
  (this->m_staticArena).m_ptr = (char *)this;
  this->m_id = 0;
  this->m_visibility = Local;
  (this->m_libraryName)._M_dataplus._M_p = (pointer)&(this->m_libraryName).field_2;
  (this->m_libraryName)._M_string_length = 0;
  (this->m_libraryName).field_2._M_local_buf[0] = '\0';
  (this->m_parts).
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Tp_alloc_type.m_arena = &this->m_staticArena;
  (this->m_parts).
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_parts).
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_parts).
  super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

StaticArena() noexcept : m_ptr(m_buffer) {}